

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O1

void test_get_regex_literal(wstring_view text)

{
  wstring_view text_00;
  int iVar1;
  version v;
  wostream *pwVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  size_type __rlen;
  size_t __n;
  wstring _r;
  wchar_t *in_stack_ffffffffffffffc8;
  wchar_t *pwVar4;
  size_t local_30;
  long local_28 [2];
  
  __n = text._M_len;
  text_00._M_str = in_stack_ffffffffffffffc8;
  text_00._M_len = 0x118760;
  get_one_regexp_literal_abi_cxx11_(text_00);
  pwVar4 = in_stack_ffffffffffffffc8;
  if (local_30 == __n) {
    if (__n != 0) {
      iVar1 = wmemcmp(text._M_str,in_stack_ffffffffffffffc8,__n);
      if (iVar1 != 0) goto LAB_001187aa;
    }
    if (in_stack_ffffffffffffffc8 != (wchar_t *)local_28) {
      operator_delete(in_stack_ffffffffffffffc8,local_28[0] * 4 + 4);
    }
    return;
  }
LAB_001187aa:
  pwVar2 = std::operator<<((wostream *)&std::wcerr,"test_get_regex_literal");
  pwVar2 = std::operator<<(pwVar2," in ");
  pwVar2 = std::operator<<(pwVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                          );
  pwVar2 = std::operator<<(pwVar2,":");
  pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,0x8f);
  pwVar2 = std::operator<<(pwVar2,":\n");
  pwVar2 = std::operator<<(pwVar2,"text");
  pwVar2 = std::operator<<(pwVar2," != ");
  pwVar2 = std::operator<<(pwVar2,"get_one_regexp_literal(text)");
  pwVar2 = std::operator<<(pwVar2,"\n");
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,text._M_str,__n);
  pwVar2 = std::operator<<(pwVar2," != ");
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,pwVar4,local_30);
  pwVar2 = std::operator<<(pwVar2,"\n");
  v = tested_version();
  pbVar3 = mjs::operator<<(pwVar2,v);
  std::operator<<(pbVar3,"\n");
  abort();
}

Assistant:

void test_get_regex_literal(std::wstring_view text) {
    REQUIRE_EQ(text, get_one_regexp_literal(text));
}